

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# if_conversion.cpp
# Opt level: O1

Status __thiscall spvtools::opt::IfConversion::Process(IfConversion *this)

{
  IRContext *pIVar1;
  Module *pMVar2;
  __uniq_ptr_data<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>,_true,_true>
  f;
  BasicBlock *block;
  undefined8 *puVar3;
  byte bVar4;
  pointer puVar5;
  bool bVar6;
  char cVar7;
  DominatorAnalysis *dominators;
  pointer puVar8;
  Status SVar9;
  pointer puVar10;
  Instruction *pIVar11;
  pointer puVar12;
  undefined8 *puVar13;
  Instruction *pIVar14;
  bool modified;
  BasicBlock *common;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> to_kill;
  InstructionBuilder builder;
  byte local_e1;
  BasicBlock *local_e0;
  undefined8 **local_d8;
  undefined8 uStack_d0;
  code *local_c8;
  code *pcStack_c0;
  undefined8 *local_b8;
  undefined8 *puStack_b0;
  long local_a8;
  undefined8 *local_98;
  undefined8 uStack_90;
  code *local_88;
  code *pcStack_80;
  pointer local_78;
  pointer local_70;
  ValueNumberTable *local_68;
  pointer local_60;
  Instruction *local_58;
  IRContext *local_50;
  BasicBlock *local_48;
  Instruction *local_40;
  undefined4 local_38;
  
  pIVar1 = (this->super_Pass).context_;
  if ((pIVar1->feature_mgr_)._M_t.
      super___uniq_ptr_impl<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
      ._M_t.
      super__Tuple_impl<0UL,_spvtools::opt::FeatureManager_*,_std::default_delete<spvtools::opt::FeatureManager>_>
      .super__Head_base<0UL,_spvtools::opt::FeatureManager_*,_false>._M_head_impl ==
      (FeatureManager *)0x0) {
    IRContext::AnalyzeFeatures(pIVar1);
  }
  bVar6 = EnumSet<spv::Capability>::contains
                    (&((pIVar1->feature_mgr_)._M_t.
                       super___uniq_ptr_impl<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_spvtools::opt::FeatureManager_*,_std::default_delete<spvtools::opt::FeatureManager>_>
                       .super__Head_base<0UL,_spvtools::opt::FeatureManager_*,_false>._M_head_impl)
                      ->capabilities_,Shader);
  SVar9 = SuccessWithoutChange;
  if (bVar6) {
    pIVar1 = (this->super_Pass).context_;
    if ((pIVar1->valid_analyses_ & kAnalysisValueNumberTable) == kAnalysisNone) {
      IRContext::BuildValueNumberTable(pIVar1);
    }
    local_68 = (pIVar1->vn_table_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::ValueNumberTable,_std::default_delete<spvtools::opt::ValueNumberTable>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::ValueNumberTable_*,_std::default_delete<spvtools::opt::ValueNumberTable>_>
               .super__Head_base<0UL,_spvtools::opt::ValueNumberTable_*,_false>._M_head_impl;
    local_e1 = 0;
    local_b8 = (undefined8 *)0x0;
    puStack_b0 = (undefined8 *)0x0;
    local_a8 = 0;
    pMVar2 = (((this->super_Pass).context_)->module_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
             .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
    puVar8 = *(pointer *)
              &(pMVar2->functions_).
               super__Vector_base<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>,_std::allocator<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>_>_>
               ._M_impl;
    local_78 = *(pointer *)
                ((long)&(pMVar2->functions_).
                        super__Vector_base<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>,_std::allocator<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>_>_>
                + 8);
    puVar13 = local_b8;
    puVar3 = puStack_b0;
    if (puVar8 != local_78) {
      do {
        f.
        super___uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
        ._M_t.
        super__Tuple_impl<0UL,_spvtools::opt::Function_*,_std::default_delete<spvtools::opt::Function>_>
        .super__Head_base<0UL,_spvtools::opt::Function_*,_false>._M_head_impl =
             (puVar8->_M_t).
             super___uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
        ;
        local_70 = puVar8;
        dominators = IRContext::GetDominatorAnalysis
                               ((this->super_Pass).context_,
                                (Function *)
                                f.
                                super___uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_spvtools::opt::Function_*,_std::default_delete<spvtools::opt::Function>_>
                                .super__Head_base<0UL,_spvtools::opt::Function_*,_false>.
                                _M_head_impl);
        puVar10 = *(pointer *)
                   &(((vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                       *)((long)f.
                                super___uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_spvtools::opt::Function_*,_std::default_delete<spvtools::opt::Function>_>
                                .super__Head_base<0UL,_spvtools::opt::Function_*,_false>.
                                _M_head_impl + 0x98))->
                    super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                    )._M_impl;
        puVar12 = *(pointer *)
                   ((long)f.
                          super___uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_spvtools::opt::Function_*,_std::default_delete<spvtools::opt::Function>_>
                          .super__Head_base<0UL,_spvtools::opt::Function_*,_false>._M_head_impl +
                   0xa0);
        puVar5 = puVar12;
        if (puVar10 != puVar12) {
          do {
            local_60 = puVar5;
            block = (puVar10->_M_t).
                    super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                    .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
            local_e0 = (BasicBlock *)0x0;
            bVar6 = CheckBlock(this,block,dominators,&local_e0);
            if (bVar6) {
              for (pIVar11 = *(Instruction **)
                              ((long)&(block->insts_).
                                      super_IntrusiveList<spvtools::opt::Instruction>.sentinel_ + 8)
                  ; (pIVar11 !=
                     &(block->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_ &&
                    (pIVar11->opcode_ == OpPhi));
                  pIVar11 = (pIVar11->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
                            next_node_) {
              }
              pIVar1 = (this->super_Pass).context_;
              local_48 = IRContext::get_instr_block(pIVar1,pIVar11);
              local_38 = 3;
              local_88 = (code *)0x0;
              pcStack_80 = (code *)0x0;
              local_98 = (undefined8 *)0x0;
              uStack_90 = 0;
              local_50 = pIVar1;
              local_40 = pIVar11;
              local_98 = (undefined8 *)operator_new(0x40);
              *local_98 = this;
              local_98[1] = &local_50;
              local_98[2] = &local_e1;
              local_98[3] = &local_e0;
              local_98[4] = &local_b8;
              local_98[5] = dominators;
              local_98[6] = block;
              local_98[7] = local_68;
              pcStack_80 = std::
                           _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/if_conversion.cpp:50:28)>
                           ::_M_invoke;
              local_88 = std::
                         _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/if_conversion.cpp:50:28)>
                         ::_M_manager;
              uStack_d0 = 0;
              local_d8 = &local_98;
              pcStack_c0 = std::
                           _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/basic_block.h:332:7)>
                           ::_M_invoke;
              local_c8 = std::
                         _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/basic_block.h:332:7)>
                         ::_M_manager;
              pIVar11 = *(Instruction **)
                         ((long)&(block->insts_).super_IntrusiveList<spvtools::opt::Instruction>.
                                 sentinel_ + 8);
              if ((pIVar11 != (Instruction *)0x0) &&
                 ((pIVar11->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ ==
                  false)) {
                do {
                  if (pIVar11 == (Instruction *)0x0) break;
                  pIVar14 = (pIVar11->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
                            next_node_;
                  cVar7 = '\0';
                  if ((pIVar14->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ !=
                      false) {
                    pIVar14 = (Instruction *)0x0;
                  }
                  if (pIVar11->opcode_ == OpPhi) {
                    local_58 = pIVar11;
                    if (local_c8 == (code *)0x0) {
                      std::__throw_bad_function_call();
                    }
                    cVar7 = (*pcStack_c0)(&local_d8,&local_58);
                    if (cVar7 != '\0') {
                      pIVar11 = pIVar14;
                    }
                  }
                } while (cVar7 != '\0');
              }
              if (local_c8 != (code *)0x0) {
                (*local_c8)(&local_d8,&local_d8,3);
              }
              puVar12 = local_60;
              if (local_88 != (code *)0x0) {
                (*local_88)(&local_98,&local_98,3);
              }
            }
            puVar10 = puVar10 + 1;
            puVar5 = local_60;
          } while (puVar10 != puVar12);
        }
        puVar8 = local_70 + 1;
        puVar13 = local_b8;
        puVar3 = puStack_b0;
      } while (puVar8 != local_78);
    }
    for (; bVar4 = local_e1, puVar13 != puVar3; puVar13 = puVar13 + 1) {
      IRContext::KillInst((this->super_Pass).context_,(Instruction *)*puVar13);
    }
    if (local_b8 != (undefined8 *)0x0) {
      operator_delete(local_b8,local_a8 - (long)local_b8);
    }
    SVar9 = bVar4 ^ SuccessWithoutChange;
  }
  return SVar9;
}

Assistant:

Pass::Status IfConversion::Process() {
  if (!context()->get_feature_mgr()->HasCapability(spv::Capability::Shader)) {
    return Status::SuccessWithoutChange;
  }

  const ValueNumberTable& vn_table = *context()->GetValueNumberTable();
  bool modified = false;
  std::vector<Instruction*> to_kill;
  for (auto& func : *get_module()) {
    DominatorAnalysis* dominators = context()->GetDominatorAnalysis(&func);
    for (auto& block : func) {
      // Check if it is possible for |block| to have phis that can be
      // transformed.
      BasicBlock* common = nullptr;
      if (!CheckBlock(&block, dominators, &common)) continue;

      // Get an insertion point.
      auto iter = block.begin();
      while (iter != block.end() && iter->opcode() == spv::Op::OpPhi) {
        ++iter;
      }

      InstructionBuilder builder(
          context(), &*iter,
          IRContext::kAnalysisDefUse | IRContext::kAnalysisInstrToBlockMapping);
      block.ForEachPhiInst([this, &builder, &modified, &common, &to_kill,
                            dominators, &block, &vn_table](Instruction* phi) {
        // This phi is not compatible, but subsequent phis might be.
        if (!CheckType(phi->type_id())) return;

        // We cannot transform cases where the phi is used by another phi in the
        // same block due to instruction ordering restrictions.
        // TODO(alan-baker): If all inappropriate uses could also be
        // transformed, we could still remove this phi.
        if (!CheckPhiUsers(phi, &block)) return;

        // Identify the incoming values associated with the true and false
        // branches. If |then_block| dominates |inc0| or if the true edge
        // branches straight to this block and |common| is |inc0|, then |inc0|
        // is on the true branch. Otherwise the |inc1| is on the true branch.
        BasicBlock* inc0 = GetIncomingBlock(phi, 0u);
        Instruction* branch = common->terminator();
        uint32_t condition = branch->GetSingleWordInOperand(0u);
        BasicBlock* then_block = GetBlock(branch->GetSingleWordInOperand(1u));
        Instruction* true_value = nullptr;
        Instruction* false_value = nullptr;
        if ((then_block == &block && inc0 == common) ||
            dominators->Dominates(then_block, inc0)) {
          true_value = GetIncomingValue(phi, 0u);
          false_value = GetIncomingValue(phi, 1u);
        } else {
          true_value = GetIncomingValue(phi, 1u);
          false_value = GetIncomingValue(phi, 0u);
        }

        BasicBlock* true_def_block = context()->get_instr_block(true_value);
        BasicBlock* false_def_block = context()->get_instr_block(false_value);

        uint32_t true_vn = vn_table.GetValueNumber(true_value);
        uint32_t false_vn = vn_table.GetValueNumber(false_value);
        if (true_vn != 0 && true_vn == false_vn) {
          Instruction* inst_to_use = nullptr;

          // Try to pick an instruction that is not in a side node.  If we can't
          // pick either the true for false branch as long as they can be
          // legally moved.
          if (!true_def_block ||
              dominators->Dominates(true_def_block, &block)) {
            inst_to_use = true_value;
          } else if (!false_def_block ||
                     dominators->Dominates(false_def_block, &block)) {
            inst_to_use = false_value;
          } else if (CanHoistInstruction(true_value, common, dominators)) {
            inst_to_use = true_value;
          } else if (CanHoistInstruction(false_value, common, dominators)) {
            inst_to_use = false_value;
          }

          if (inst_to_use != nullptr) {
            modified = true;
            HoistInstruction(inst_to_use, common, dominators);
            context()->KillNamesAndDecorates(phi);
            context()->ReplaceAllUsesWith(phi->result_id(),
                                          inst_to_use->result_id());
          }
          return;
        }

        // If either incoming value is defined in a block that does not dominate
        // this phi, then we cannot eliminate the phi with a select.
        // TODO(alan-baker): Perform code motion where it makes sense to enable
        // the transform in this case.
        if (true_def_block && !dominators->Dominates(true_def_block, &block))
          return;

        if (false_def_block && !dominators->Dominates(false_def_block, &block))
          return;

        analysis::Type* data_ty =
            context()->get_type_mgr()->GetType(true_value->type_id());
        if (analysis::Vector* vec_data_ty = data_ty->AsVector()) {
          condition = SplatCondition(vec_data_ty, condition, &builder);
        }

        Instruction* select = builder.AddSelect(phi->type_id(), condition,
                                                true_value->result_id(),
                                                false_value->result_id());
        context()->get_def_use_mgr()->AnalyzeInstDefUse(select);
        select->UpdateDebugInfoFrom(phi);
        context()->ReplaceAllUsesWith(phi->result_id(), select->result_id());
        to_kill.push_back(phi);
        modified = true;

        return;
      });
    }
  }

  for (auto inst : to_kill) {
    context()->KillInst(inst);
  }

  return modified ? Status::SuccessWithChange : Status::SuccessWithoutChange;
}